

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strfmt.c
# Opt level: O3

SBuf * strfmt_putfstrlen(SBuf *sb,SFormat sf,char *s,MSize len)

{
  uint uVar1;
  uint sz;
  ulong __n;
  uint uVar2;
  char *__dest;
  
  uVar2 = sf >> 0x10 & 0xff;
  uVar1 = (sf >> 0x18) - 1;
  if (len <= uVar1) {
    uVar1 = len;
  }
  sz = uVar1;
  if (uVar1 < uVar2) {
    sz = uVar2;
  }
  __dest = sb->w;
  if ((uint)(*(int *)&sb->e - (int)__dest) < sz) {
    __dest = lj_buf_more2(sb,sz);
  }
  __n = (ulong)uVar1;
  if ((sf >> 8 & 1) != 0) {
    memcpy(__dest,s,__n);
    __dest = __dest + __n;
  }
  if (uVar1 < uVar2) {
    memset(__dest,0x20,(ulong)(uVar2 + ~uVar1) + 1);
    __dest = __dest + (ulong)(uVar2 + ~uVar1) + 1;
  }
  if ((sf >> 8 & 1) == 0) {
    memcpy(__dest,s,__n);
    __dest = __dest + __n;
  }
  sb->w = __dest;
  return sb;
}

Assistant:

static SBuf *strfmt_putfstrlen(SBuf *sb, SFormat sf, const char *s, MSize len)
{
  MSize width = STRFMT_WIDTH(sf);
  char *w;
  if (len > STRFMT_PREC(sf)) len = STRFMT_PREC(sf);
  w = lj_buf_more(sb, width > len ? width : len);
  if ((sf & STRFMT_F_LEFT)) w = lj_buf_wmem(w, s, len);
  while (width-- > len) *w++ = ' ';
  if (!(sf & STRFMT_F_LEFT)) w = lj_buf_wmem(w, s, len);
  sb->w = w;
  return sb;
}